

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_test.cpp
# Opt level: O1

void __thiscall Image_PngRgbIO_Test::TestBody(Image_PngRgbIO_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  optional<float> oVar2;
  RGBColorSpace *expected;
  bool bVar3;
  int iVar4;
  Allocator alloc;
  RGBColorSpace *actual;
  ulong uVar5;
  _Alloc_hider _Var6;
  long lVar7;
  char *pcVar8;
  char *in_R9;
  long lVar9;
  Point2i p;
  Float FVar10;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> rgbPixels;
  ImageAndMetadata read;
  Image image;
  AssertHelper local_410;
  aligned_storage_t<sizeof(float),_alignof(float)> local_408 [2];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_400;
  string local_3f8;
  AssertHelper local_3d8;
  long local_3d0;
  ulong local_3c8;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_3c0;
  long local_3a0;
  ulong local_398;
  long local_390;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_388;
  aligned_storage_t<sizeof(float),_alignof(float)> local_368;
  uint uStack_364;
  undefined1 auStack_360 [8];
  undefined1 auStack_358 [16];
  undefined1 auStack_348 [32];
  long local_328 [2];
  long alStack_318 [8];
  aligned_storage_t<sizeof(pbrt::Bounds2<int>),_alignof(pbrt::Bounds2<int>)> aStack_2d8;
  ulong uStack_2c8;
  undefined8 uStack_2c0;
  optional<int> oStack_2b8;
  optional<float> oStack_2b0;
  aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
  local_2a8;
  ulong uStack_2a0;
  undefined1 auStack_298 [8];
  polymorphic_allocator<pbrt::Half> pStack_290;
  _Base_ptr p_Stack_288;
  _Base_ptr p_Stack_280;
  _Base_ptr p_Stack_278;
  polymorphic_allocator<float> pStack_270;
  float *local_268;
  size_t local_260;
  size_t local_258;
  ImageMetadata local_250;
  ColorEncodingHandle local_150;
  Image local_148;
  
  GetFloatPixels(&local_3c0,(Point2i)0x320000000b,3);
  local_3f8._M_dataplus._M_p = (pointer)pstd::pmr::new_delete_resource();
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
            (&local_388,&local_3c0,(polymorphic_allocator<float> *)&local_3f8);
  _local_368 = (optional<float>)auStack_358;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"R","");
  auStack_348._0_8_ = auStack_348 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_348,"G","");
  _Var6._M_p = (pointer)alStack_318;
  local_328[0] = (long)_Var6._M_p;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_328,"B","");
  channels.n = 3;
  channels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_368;
  pbrt::Image::Image(&local_148,&local_388,(Point2i)0x320000000b,channels);
  lVar9 = -0x60;
  do {
    if ((long *)_Var6._M_p != *(long **)((long)_Var6._M_p + -0x10)) {
      operator_delete(*(long **)((long)_Var6._M_p + -0x10),*(long *)_Var6._M_p + 1);
    }
    _Var6._M_p = _Var6._M_p + -0x20;
    lVar9 = lVar9 + 0x20;
  } while (lVar9 != 0);
  local_388.nStored = 0;
  (*(local_388.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_388.alloc.memoryResource,local_388.ptr,local_388.nAlloc << 2,4);
  paVar1 = &local_3f8.field_2;
  local_3f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"test.png","");
  p_Stack_280 = (_Base_ptr)&pStack_290;
  local_2a8 = (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
               )0x0;
  uStack_2a0 = 0;
  auStack_298 = (undefined1  [8])0x0;
  pStack_290.memoryResource = (memory_resource *)0x0;
  p_Stack_288 = (_Base_ptr)0x0;
  alStack_318[6] = 0;
  alStack_318[7] = 0;
  aStack_2d8._0_8_ = 0;
  aStack_2d8._8_8_ = 0;
  uStack_2c8 = 0;
  uStack_2c0 = 0;
  oStack_2b8.optionalValue = (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
  oStack_2b8.set = false;
  oStack_2b8._5_3_ = 0;
  oStack_2b0.optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
  oStack_2b0.set = false;
  oStack_2b0._5_3_ = 0;
  local_328[0] = 0;
  local_328[1] = 0;
  alStack_318[0] = 0;
  alStack_318[1] = 0;
  alStack_318[2] = 0;
  alStack_318[3] = 0;
  alStack_318[4] = 0;
  alStack_318[5] = 0;
  local_368 = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
  uStack_364 = 0;
  auStack_360._0_4_ = (anon_struct_4_0_00000001_for___align)0x0;
  auStack_360._4_4_ = 0;
  auStack_358._0_8_ = 0;
  auStack_358._8_8_ = 0;
  auStack_348._0_8_ = (pointer)0x0;
  auStack_348._8_8_ = 0;
  auStack_348._16_8_ = 0;
  auStack_348._24_8_ = 0;
  pStack_270.memoryResource = (memory_resource *)0x0;
  p_Stack_278 = p_Stack_280;
  bVar3 = pbrt::Image::Write(&local_148,&local_3f8,(ImageMetadata *)&local_368);
  local_408[0].__data[0] = bVar3;
  local_400.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               *)auStack_298);
  if (uStack_2a0._0_1_ == true) {
    uStack_2a0 = uStack_2a0 & 0xffffffffffffff00;
  }
  if (oStack_2b0.set == true) {
    oStack_2b0.set = false;
  }
  if (oStack_2b8.set == true) {
    oStack_2b8.set = false;
  }
  if (uStack_2c0._4_1_ == true) {
    uStack_2c0._0_5_ = (uint5)(uint)(undefined4)uStack_2c0;
  }
  if (uStack_2c8._0_1_ == true) {
    uStack_2c8 = uStack_2c8 & 0xffffffffffffff00;
  }
  if ((bool)alStack_318[7]._4_1_ == true) {
    alStack_318[7]._0_5_ = CONCAT14(0,(undefined4)alStack_318[7]);
  }
  if ((bool)(undefined1)local_328[1] == true) {
    local_328[1] = local_328[1] & 0xffffffffffffff00;
  }
  if (uStack_364._0_1_ == true) {
    uStack_364 = uStack_364 & 0xffffff00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
  }
  if (local_408[0].__data[0] == '\0') {
    testing::Message::Message((Message *)&local_3f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_368,(internal *)&local_408[0].__align,
               (AssertionResult *)"image.Write(\"test.png\")","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_410,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x1d1,(char *)CONCAT44(uStack_364,local_368));
    testing::internal::AssertHelper::operator=(&local_410,(Message *)&local_3f8);
    testing::internal::AssertHelper::~AssertHelper(&local_410);
    oVar2._4_4_ = uStack_364;
    oVar2.optionalValue = local_368;
    if (oVar2 != (optional<float>)auStack_358) {
      operator_delete((void *)oVar2,auStack_358._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_3f8._M_dataplus._M_p + 8))();
      }
      local_3f8._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_400,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"test.png","");
  alloc.memoryResource = pstd::pmr::new_delete_resource();
  local_150.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          )0;
  pbrt::Image::Read((ImageAndMetadata *)&local_368,&local_3f8,alloc,&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
  }
  local_408[0] = (aligned_storage_t<sizeof(float),_alignof(float)>)
                 local_148.resolution.super_Tuple2<pbrt::Point2,_int>.x;
  local_408[1] = (aligned_storage_t<sizeof(float),_alignof(float)>)
                 local_148.resolution.super_Tuple2<pbrt::Point2,_int>.y;
  local_410.data_ = (AssertHelperData *)CONCAT44(auStack_360._0_4_,uStack_364);
  testing::internal::CmpHelperEQ<pbrt::Point2<int>,pbrt::Point2<int>>
            ((internal *)&local_3f8,"image.Resolution()","read.image.Resolution()",
             (Point2<int> *)&local_408[0].__align,(Point2<int> *)&local_410);
  if ((char)local_3f8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_408[0].__align);
    if ((undefined8 *)local_3f8._M_string_length == (undefined8 *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)local_3f8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_410,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x1d4,pcVar8);
    testing::internal::AssertHelper::operator=(&local_410,(Message *)&local_408[0].__align);
    testing::internal::AssertHelper::~AssertHelper(&local_410);
    if ((Tuple2<pbrt::Point2,_int>)local_408 != (Tuple2<pbrt::Point2,_int>)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((Tuple2<pbrt::Point2,_int>)local_408 != (Tuple2<pbrt::Point2,_int>)0x0)) {
        (**(code **)(*(long *)local_408 + 8))();
      }
      local_408[0] = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
      local_408[1] = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3f8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_408[0] = local_368;
  local_410.data_ = local_410.data_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<pbrt::PixelFormat,pbrt::PixelFormat>
            ((internal *)&local_3f8,"read.image.Format()","PixelFormat::U256",
             (PixelFormat *)local_408[0].__data,(PixelFormat *)&local_410);
  if ((char)local_3f8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_408[0].__align);
    if ((undefined8 *)local_3f8._M_string_length == (undefined8 *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)local_3f8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_410,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x1d5,pcVar8);
    testing::internal::AssertHelper::operator=(&local_410,(Message *)&local_408[0].__align);
    testing::internal::AssertHelper::~AssertHelper(&local_410);
    if (local_408 != (aligned_storage_t<sizeof(float),_alignof(float)>  [2])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_408 != (aligned_storage_t<sizeof(float),_alignof(float)>  [2])0x0)) {
        (**(code **)(*(long *)local_408 + 8))();
      }
      local_408 = (aligned_storage_t<sizeof(float),_alignof(float)>  [2])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3f8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_408[0].__data[0] = oStack_2b8 != (optional<int>)0x0;
  local_400.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (oStack_2b8 == (optional<int>)0x0) {
    testing::Message::Message((Message *)&local_410);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_3f8,(internal *)&local_408[0].__align,
               (AssertionResult *)"read.image.Encoding() != nullptr","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3d8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x1d6,local_3f8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_3d8,(Message *)&local_410);
    testing::internal::AssertHelper::~AssertHelper(&local_3d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
    }
    if (local_410.data_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_410.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_410.data_ + 8))();
      }
      local_410.data_ = (AssertHelperData *)0x0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_400,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_400,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_408[0].__data[0] = local_250.colorSpace.set;
    local_400.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_250.colorSpace.set == false) {
      testing::Message::Message((Message *)&local_410);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_3f8,(internal *)&local_408[0].__align,
                 (AssertionResult *)"(bool)read.metadata.colorSpace","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_3d8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                 ,0x1d8,local_3f8._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_3d8,(Message *)&local_410);
      testing::internal::AssertHelper::~AssertHelper(&local_3d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8._M_dataplus._M_p != paVar1) {
        operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
      }
      if (local_410.data_ != (AssertHelperData *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) && (local_410.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_410.data_ + 8))();
        }
        local_410.data_ = (AssertHelperData *)0x0;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_400,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_400,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      if (local_250.colorSpace.set == false) {
        pbrt::LogFatal<char_const(&)[4]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                   ,0xea,"Check failed: %s",(char (*) [4])0x3089585);
      }
      local_408[0].__data[0] =
           local_250.colorSpace.optionalValue !=
           (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
            )0x0;
      local_400.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_250.colorSpace.optionalValue ==
          (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
           )0x0) {
        testing::Message::Message((Message *)&local_410);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_3f8,(internal *)&local_408[0].__align,
                   (AssertionResult *)"*read.metadata.colorSpace != nullptr","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_3d8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                   ,0x1d9,local_3f8._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_3d8,(Message *)&local_410);
        testing::internal::AssertHelper::~AssertHelper(&local_3d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != paVar1) {
          operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
        }
        if (local_410.data_ != (AssertHelperData *)0x0) {
          bVar3 = testing::internal::IsTrue(true);
          if ((bVar3) && (local_410.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_410.data_ + 8))();
          }
          local_410.data_ = (AssertHelperData *)0x0;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_400,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        ;
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_400,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        ;
        expected = pbrt::RGBColorSpace::sRGB;
        actual = pbrt::ImageMetadata::GetColorSpace(&local_250);
        testing::internal::CmpHelperEQ<pbrt::RGBColorSpace,pbrt::RGBColorSpace>
                  ((internal *)&local_3f8,"*RGBColorSpace::sRGB","*read.metadata.GetColorSpace()",
                   expected,actual);
        if ((char)local_3f8._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_408[0].__align);
          if ((undefined8 *)local_3f8._M_string_length == (undefined8 *)0x0) {
            pcVar8 = "";
          }
          else {
            pcVar8 = *(char **)local_3f8._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_410,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                     ,0x1da,pcVar8);
          testing::internal::AssertHelper::operator=(&local_410,(Message *)&local_408[0].__align);
          testing::internal::AssertHelper::~AssertHelper(&local_410);
          if (local_408 != (aligned_storage_t<sizeof(float),_alignof(float)>  [2])0x0) {
            bVar3 = testing::internal::IsTrue(true);
            if ((bVar3) && (local_408 != (aligned_storage_t<sizeof(float),_alignof(float)>  [2])0x0)
               ) {
              (**(code **)(*(long *)local_408 + 8))();
            }
            local_408 = (aligned_storage_t<sizeof(float),_alignof(float)>  [2])0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_3f8._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        lVar7 = 0;
        lVar9 = 0;
        do {
          local_398 = lVar9 << 0x20;
          uVar5 = 0;
          local_3d0 = lVar9;
          local_3a0 = lVar7;
          do {
            p.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)(local_398 | uVar5);
            lVar9 = 0;
            local_3c8 = uVar5;
            local_390 = lVar7;
            do {
              iVar4 = (int)lVar9;
              FVar10 = pbrt::Image::GetChannel(&local_148,p,iVar4,(WrapMode2D)0x200000002);
              FVar10 = sRGBRoundTrip(FVar10,-0.5);
              local_408[0] = (aligned_storage_t<sizeof(float),_alignof(float)>)FVar10;
              FVar10 = pbrt::Image::GetChannel((Image *)&local_368,p,iVar4,(WrapMode2D)0x200000002);
              local_410.data_._0_4_ = FVar10;
              testing::internal::CmpHelperLE<float,float>
                        ((internal *)&local_3f8,"sRGBRoundTrip(image.GetChannel({x, y}, c), -.5f)",
                         "read.image.GetChannel({x, y}, c)",(float *)local_408,(float *)&local_410);
              if ((char)local_3f8._M_dataplus._M_p == '\0') {
                testing::Message::Message((Message *)&local_408[0].__align);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)((long)local_408 + 0x10)," x ",3);
                std::ostream::operator<<((ostream *)((long)local_408 + 0x10),(int)local_3c8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)((long)local_408 + 0x10),", y ",4);
                std::ostream::operator<<((ostream *)((long)local_408 + 0x10),(int)local_3d0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)((long)local_408 + 0x10),", c ",4);
                std::ostream::operator<<((ostream *)((long)local_408 + 0x10),iVar4);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)((long)local_408 + 0x10),", orig ",7);
                std::ostream::_M_insert<double>((double)*(float *)((long)local_3c0.ptr + lVar7));
                pcVar8 = "";
                if ((undefined8 *)local_3f8._M_string_length != (undefined8 *)0x0) {
                  pcVar8 = *(char **)local_3f8._M_string_length;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_410,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                           ,0x1e0,pcVar8);
                testing::internal::AssertHelper::operator=
                          (&local_410,(Message *)&local_408[0].__align);
                testing::internal::AssertHelper::~AssertHelper(&local_410);
                if (local_408 != (aligned_storage_t<sizeof(float),_alignof(float)>  [2])0x0) {
                  bVar3 = testing::internal::IsTrue(true);
                  if ((bVar3) &&
                     (local_408 != (aligned_storage_t<sizeof(float),_alignof(float)>  [2])0x0)) {
                    (**(code **)(*(long *)local_408 + 8))();
                  }
                  local_408 = (aligned_storage_t<sizeof(float),_alignof(float)>  [2])0x0;
                }
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_3f8._M_string_length,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              FVar10 = pbrt::Image::GetChannel((Image *)&local_368,p,iVar4,(WrapMode2D)0x200000002);
              local_408[0] = (aligned_storage_t<sizeof(float),_alignof(float)>)FVar10;
              FVar10 = pbrt::Image::GetChannel(&local_148,p,iVar4,(WrapMode2D)0x200000002);
              FVar10 = sRGBRoundTrip(FVar10,0.5);
              local_410.data_._0_4_ = FVar10;
              testing::internal::CmpHelperLE<float,float>
                        ((internal *)&local_3f8,"read.image.GetChannel({x, y}, c)",
                         "sRGBRoundTrip(image.GetChannel({x, y}, c), 0.5f)",(float *)local_408,
                         (float *)&local_410);
              if ((char)local_3f8._M_dataplus._M_p == '\0') {
                testing::Message::Message((Message *)&local_408[0].__align);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)((long)local_408 + 0x10)," x ",3);
                std::ostream::operator<<((ostream *)((long)local_408 + 0x10),(int)local_3c8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)((long)local_408 + 0x10),", y ",4);
                std::ostream::operator<<((ostream *)((long)local_408 + 0x10),(int)local_3d0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)((long)local_408 + 0x10),", c ",4);
                std::ostream::operator<<((ostream *)((long)local_408 + 0x10),iVar4);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)((long)local_408 + 0x10),", orig ",7);
                std::ostream::_M_insert<double>((double)*(float *)((long)local_3c0.ptr + lVar7));
                pcVar8 = "";
                if ((undefined8 *)local_3f8._M_string_length != (undefined8 *)0x0) {
                  pcVar8 = *(char **)local_3f8._M_string_length;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_410,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                           ,0x1e4,pcVar8);
                testing::internal::AssertHelper::operator=
                          (&local_410,(Message *)&local_408[0].__align);
                testing::internal::AssertHelper::~AssertHelper(&local_410);
                if (local_408 != (aligned_storage_t<sizeof(float),_alignof(float)>  [2])0x0) {
                  bVar3 = testing::internal::IsTrue(true);
                  if ((bVar3) &&
                     (local_408 != (aligned_storage_t<sizeof(float),_alignof(float)>  [2])0x0)) {
                    (**(code **)(*(long *)local_408 + 8))();
                  }
                  local_408 = (aligned_storage_t<sizeof(float),_alignof(float)>  [2])0x0;
                }
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_3f8._M_string_length,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              lVar9 = lVar9 + 1;
              lVar7 = lVar7 + 4;
            } while (lVar9 != 3);
            uVar5 = local_3c8 + 1;
            lVar7 = local_390 + 0xc;
          } while (uVar5 != 0xb);
          lVar9 = local_3d0 + 1;
          lVar7 = local_3a0 + 0x84;
        } while (lVar9 != 0x32);
        local_408 = (aligned_storage_t<sizeof(float),_alignof(float)>  [2])
                    ((ulong)local_408 & 0xffffffff00000000);
        iVar4 = remove("test.png");
        local_410.data_._0_4_ = (Float)iVar4;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&local_3f8,"0","remove(\"test.png\")",(int *)local_408[0].__data,
                   (int *)&local_410);
        if ((char)local_3f8._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_408[0].__align);
          if ((undefined8 *)local_3f8._M_string_length == (undefined8 *)0x0) {
            pcVar8 = "";
          }
          else {
            pcVar8 = *(char **)local_3f8._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_410,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                     ,0x1e9,pcVar8);
          testing::internal::AssertHelper::operator=(&local_410,(Message *)&local_408[0].__align);
          testing::internal::AssertHelper::~AssertHelper(&local_410);
          if (local_408 != (aligned_storage_t<sizeof(float),_alignof(float)>  [2])0x0) {
            bVar3 = testing::internal::IsTrue(true);
            if ((bVar3) && (local_408 != (aligned_storage_t<sizeof(float),_alignof(float)>  [2])0x0)
               ) {
              (**(code **)(*(long *)local_408 + 8))();
            }
            local_408 = (aligned_storage_t<sizeof(float),_alignof(float)>  [2])0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_3f8._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree(&local_250.stringVectors._M_t);
  if (local_250.colorSpace.set == true) {
    local_250.colorSpace.set = false;
  }
  if (local_250.MSE.set == true) {
    local_250.MSE.set = false;
  }
  if (local_250.samplesPerPixel.set == true) {
    local_250.samplesPerPixel.set = false;
  }
  if (local_250.fullResolution.set == true) {
    local_250.fullResolution.set = false;
  }
  if (local_250.pixelBounds.set == true) {
    local_250.pixelBounds.set = false;
  }
  if (local_250.NDCFromWorld.set == true) {
    local_250.NDCFromWorld.set = false;
  }
  if (local_250.cameraFromWorld.set == true) {
    local_250.cameraFromWorld.set = false;
  }
  if (local_250.renderTimeSeconds.set == true) {
    local_250.renderTimeSeconds.set = false;
  }
  local_258 = 0;
  (*(pStack_270.memoryResource)->_vptr_memory_resource[3])
            (pStack_270.memoryResource,local_268,local_260 << 2,4);
  p_Stack_278 = (_Base_ptr)0x0;
  (*(pStack_290.memoryResource)->_vptr_memory_resource[3])
            (pStack_290.memoryResource,p_Stack_288,(long)p_Stack_280 * 2,2);
  auStack_298 = (undefined1  [8])0x0;
  (**(code **)(*(long *)oStack_2b0 + 0x18))(oStack_2b0,local_2a8,uStack_2a0,1);
  pbrt::
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~InlinedVector((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)auStack_358);
  local_148.p32.nStored = 0;
  (*(local_148.p32.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_148.p32.alloc.memoryResource,local_148.p32.ptr,local_148.p32.nAlloc << 2,4);
  local_148.p16.nStored = 0;
  (*(local_148.p16.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_148.p16.alloc.memoryResource,local_148.p16.ptr,local_148.p16.nAlloc * 2,2);
  local_148.p8.nStored = 0;
  (*(local_148.p8.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_148.p8.alloc.memoryResource,local_148.p8.ptr,local_148.p8.nAlloc,1);
  pbrt::
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~InlinedVector(&local_148.channelNames);
  local_3c0.nStored = 0;
  (*(local_3c0.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_3c0.alloc.memoryResource,local_3c0.ptr,local_3c0.nAlloc << 2,4);
  return;
}

Assistant:

TEST(Image, PngRgbIO) {
    Point2i res(11, 50);
    pstd::vector<float> rgbPixels = GetFloatPixels(res, 3);

    Image image(rgbPixels, res, {"R", "G", "B"});
    EXPECT_TRUE(image.Write("test.png"));
    ImageAndMetadata read = Image::Read("test.png");

    EXPECT_EQ(image.Resolution(), read.image.Resolution());
    EXPECT_EQ(read.image.Format(), PixelFormat::U256);
    ASSERT_TRUE(read.image.Encoding() != nullptr);
    // EXPECT_EQ(*read.image.Encoding(), *ColorEncodingHandle::sRGB);
    ASSERT_TRUE((bool)read.metadata.colorSpace);
    ASSERT_TRUE(*read.metadata.colorSpace != nullptr);
    EXPECT_EQ(*RGBColorSpace::sRGB, *read.metadata.GetColorSpace());

    for (int y = 0; y < res[1]; ++y)
        for (int x = 0; x < res[0]; ++x)
            for (int c = 0; c < 3; ++c) {
                EXPECT_LE(sRGBRoundTrip(image.GetChannel({x, y}, c), -.5f),
                          read.image.GetChannel({x, y}, c))
                    << " x " << x << ", y " << y << ", c " << c << ", orig "
                    << rgbPixels[3 * y * res[0] + 3 * x + c];
                EXPECT_LE(read.image.GetChannel({x, y}, c),
                          sRGBRoundTrip(image.GetChannel({x, y}, c), 0.5f))
                    << " x " << x << ", y " << y << ", c " << c << ", orig "
                    << rgbPixels[3 * y * res[0] + 3 * x + c];
            }

    EXPECT_EQ(0, remove("test.png"));
}